

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiann.cpp
# Opt level: O0

void __thiscall MultiANN::ResetMultiANN(MultiANN *this)

{
  void *pvVar1;
  long in_RDI;
  int k;
  ANNpointArray *in_stack_ffffffffffffffd0;
  undefined4 in_stack_fffffffffffffff0;
  int iVar2;
  
  for (iVar2 = 0; iVar2 < 0x1f; iVar2 = iVar2 + 1) {
    if ((*(long *)(in_RDI + 0x38 + (long)iVar2 * 8) != 0) &&
       (pvVar1 = *(void **)(in_RDI + 0x38 + (long)iVar2 * 8), pvVar1 != (void *)0x0)) {
      ANN::~ANN((ANN *)CONCAT44(iVar2,in_stack_fffffffffffffff0));
      operator_delete(pvVar1);
    }
    *(undefined8 *)(in_RDI + 0x38 + (long)iVar2 * 8) = 0;
  }
  annDeallocPts(in_stack_ffffffffffffffd0);
  if (*(void **)(in_RDI + 0x18) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0x18));
  }
  annDeallocPt((ANNpoint *)in_stack_ffffffffffffffd0);
  if (*(void **)(in_RDI + 0x28) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0x28));
  }
  return;
}

Assistant:

void MultiANN::ResetMultiANN()  // destroys all the arrays of data points
{
    for (int k = 0; k < ANN_MAXIMUM_INDEX + 1; k++) {
        if (AnnArray[k]) delete (AnnArray[k]);
        AnnArray[k] = NULL;
    }
    annDeallocPts(points_coor);  // deallocate coordinates of data points
    delete[] points_ptr;         // deallocate pointers to data points
    annDeallocPt(scaling);       // deallocate scaling
    delete[] topology;           // deallocate topology
}